

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall
cmMakefile::AddRequiredTargetCxxFeature
          (cmMakefile *this,cmTarget *target,string *feature,string *error)

{
  pointer pcVar1;
  cmake *this_00;
  bool bVar2;
  bool bVar3;
  cmTarget *this_01;
  char *__s;
  char **ppcVar4;
  ostream *poVar5;
  size_t sVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool needCxx17;
  bool needCxx14;
  bool needCxx11;
  bool needCxx98;
  ostringstream e;
  bool local_29c;
  bool local_29b;
  bool local_29a;
  bool local_299;
  char **local_298;
  cmTarget *local_290;
  string local_288;
  long *local_268 [2];
  long local_258 [2];
  long *local_248 [2];
  long local_238 [2];
  long *local_228 [2];
  long local_218 [2];
  long *local_208 [2];
  long local_1f8 [2];
  undefined1 local_1e8 [112];
  ios_base local_178 [264];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_299 = false;
  local_29a = false;
  local_29b = false;
  local_29c = false;
  CheckNeededCxxLanguage(this,feature,&local_299,&local_29a,&local_29b,&local_29c);
  local_1e8._0_8_ = local_1e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"CXX_STANDARD","");
  local_290 = target;
  __s = cmTarget::GetProperty(target,(string *)local_1e8);
  if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
  }
  if (__s == (char *)0x0) {
    local_298 = &PTR_anon_var_dwarf_1bdebf_0068c950;
  }
  else {
    std::__cxx11::string::string((string *)local_50,__s,(allocator *)local_1e8);
    ppcVar4 = std::find_if<char_const*const*,cmStrCmp>
                        (CXX_STANDARDS,&PTR_anon_var_dwarf_1bdebf_0068c950,(cmStrCmp *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if (ppcVar4 == &PTR_anon_var_dwarf_1bdebf_0068c950) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,"The CXX_STANDARD property on target \"",0x25);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1e8,(local_290->Name)._M_dataplus._M_p,
                          (local_290->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"\" contained an invalid value: \"",0x1f);
      sVar6 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,__s,sVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\".",2);
      if (error == (string *)0x0) {
        this_00 = this->GlobalGenerator->CMakeInstance;
        std::__cxx11::stringbuf::str();
        cmake::IssueMessage(this_00,FATAL_ERROR,&local_288,&this->Backtrace);
      }
      else {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)error,(string *)&local_288);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
      std::ios_base::~ios_base(local_178);
      return false;
    }
    std::__cxx11::string::string((string *)local_70,__s,(allocator *)local_1e8);
    local_298 = std::find_if<char_const*const*,cmStrCmp>
                          (CXX_STANDARDS,&PTR_anon_var_dwarf_1bdebf_0068c950,(cmStrCmp *)local_70);
  }
  if ((__s != (char *)0x0) && (local_70[0] != local_60)) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  bVar3 = local_299;
  bVar2 = local_29a;
  bVar13 = local_29b;
  bVar14 = local_29c;
  bVar15 = __s == (char *)0x0;
  bVar8 = !bVar15 & local_29c;
  if (bVar8 == 1) {
    local_248[0] = local_238;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"17","");
    ppcVar4 = std::find_if<char_const*const*,cmStrCmp>
                        (CXX_STANDARDS,&PTR_anon_var_dwarf_1bdebf_0068c950,(cmStrCmp *)local_248);
    bVar12 = local_298 < ppcVar4;
  }
  else {
    bVar12 = false;
  }
  if ((bVar8 != 0) && (local_248[0] != local_238)) {
    operator_delete(local_248[0],local_238[0] + 1);
  }
  bVar8 = bVar15 & bVar3;
  bVar7 = bVar15 & bVar2;
  bVar9 = bVar15 & bVar13;
  if (bVar12) {
    bVar10 = 1;
  }
  else {
    bVar10 = __s != (char *)0x0 & bVar13;
    if (bVar10 == 1) {
      local_268[0] = local_258;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"14","");
      ppcVar4 = std::find_if<char_const*const*,cmStrCmp>
                          (CXX_STANDARDS,&PTR_anon_var_dwarf_1bdebf_0068c950,(cmStrCmp *)local_268);
      bVar13 = local_298 < ppcVar4;
    }
    else {
      bVar13 = false;
    }
    if ((bVar10 != 0) && (local_268[0] != local_258)) {
      operator_delete(local_268[0],local_258[0] + 1);
    }
    bVar10 = bVar15 & bVar14;
    if (bVar13) {
      bVar9 = 1;
    }
    else {
      bVar11 = __s != (char *)0x0 & bVar2;
      if (bVar11 == 1) {
        local_208[0] = local_1f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"11","");
        ppcVar4 = std::find_if<char_const*const*,cmStrCmp>
                            (CXX_STANDARDS,&PTR_anon_var_dwarf_1bdebf_0068c950,(cmStrCmp *)local_208
                            );
        bVar14 = local_298 < ppcVar4;
      }
      else {
        bVar14 = false;
      }
      if ((bVar11 != 0) && (local_208[0] != local_1f8)) {
        operator_delete(local_208[0],local_1f8[0] + 1);
      }
      if (bVar14) {
        bVar7 = 1;
      }
      else {
        bVar11 = __s != (char *)0x0 & bVar3;
        if (bVar11 == 1) {
          local_228[0] = local_218;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"98","");
          ppcVar4 = std::find_if<char_const*const*,cmStrCmp>
                              (CXX_STANDARDS,&PTR_anon_var_dwarf_1bdebf_0068c950,
                               (cmStrCmp *)local_228);
          bVar14 = local_298 < ppcVar4;
        }
        else {
          bVar14 = false;
        }
        if ((bVar11 != 0) && (local_228[0] != local_218)) {
          operator_delete(local_228[0],local_218[0] + 1);
        }
        bVar8 = bVar8 | bVar14;
      }
    }
  }
  this_01 = local_290;
  if (bVar10 == 0) {
    if (bVar9 == 0) {
      pcVar1 = local_1e8 + 0x10;
      local_1e8._0_8_ = pcVar1;
      if (bVar7 == 0) {
        if (bVar8 == 0) {
          return true;
        }
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"CXX_STANDARD","");
        cmTarget::SetProperty(this_01,(string *)local_1e8,"98");
        if ((pointer)local_1e8._0_8_ != pcVar1) {
          operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
        }
        local_1e8._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"CUDA_STANDARD","");
        cmTarget::SetProperty(this_01,(string *)local_1e8,"98");
        if ((pointer)local_1e8._0_8_ == pcVar1) {
          return true;
        }
        operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
        return true;
      }
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"CXX_STANDARD","");
      cmTarget::SetProperty(this_01,(string *)local_1e8,"11");
      if ((pointer)local_1e8._0_8_ != pcVar1) {
        operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
      }
      local_1e8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"CUDA_STANDARD","");
      cmTarget::SetProperty(this_01,(string *)local_1e8,"11");
    }
    else {
      pcVar1 = local_1e8 + 0x10;
      local_1e8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"CXX_STANDARD","");
      cmTarget::SetProperty(this_01,(string *)local_1e8,"14");
      if ((pointer)local_1e8._0_8_ != pcVar1) {
        operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
      }
      local_1e8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"CUDA_STANDARD","");
      cmTarget::SetProperty(this_01,(string *)local_1e8,"14");
    }
  }
  else {
    pcVar1 = local_1e8 + 0x10;
    local_1e8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"CXX_STANDARD","");
    cmTarget::SetProperty(this_01,(string *)local_1e8,"17");
    if ((pointer)local_1e8._0_8_ != pcVar1) {
      operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
    }
    local_1e8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"CUDA_STANDARD","");
    cmTarget::SetProperty(this_01,(string *)local_1e8,"17");
  }
  if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
  }
  return true;
}

Assistant:

bool cmMakefile::AddRequiredTargetCxxFeature(cmTarget* target,
                                             const std::string& feature,
                                             std::string* error) const
{
  bool needCxx98 = false;
  bool needCxx11 = false;
  bool needCxx14 = false;
  bool needCxx17 = false;

  this->CheckNeededCxxLanguage(feature, needCxx98, needCxx11, needCxx14,
                               needCxx17);

  const char* existingCxxStandard = target->GetProperty("CXX_STANDARD");
  if (existingCxxStandard) {
    if (std::find_if(cmArrayBegin(CXX_STANDARDS), cmArrayEnd(CXX_STANDARDS),
                     cmStrCmp(existingCxxStandard)) ==
        cmArrayEnd(CXX_STANDARDS)) {
      std::ostringstream e;
      e << "The CXX_STANDARD property on target \"" << target->GetName()
        << "\" contained an invalid value: \"" << existingCxxStandard << "\".";
      if (error) {
        *error = e.str();
      } else {
        this->GetCMakeInstance()->IssueMessage(cmake::FATAL_ERROR, e.str(),
                                               this->Backtrace);
      }
      return false;
    }
  }
  const char* const* existingCxxIt = existingCxxStandard
    ? std::find_if(cmArrayBegin(CXX_STANDARDS), cmArrayEnd(CXX_STANDARDS),
                   cmStrCmp(existingCxxStandard))
    : cmArrayEnd(CXX_STANDARDS);

  bool setCxx98 = needCxx98 && !existingCxxStandard;
  bool setCxx11 = needCxx11 && !existingCxxStandard;
  bool setCxx14 = needCxx14 && !existingCxxStandard;
  bool setCxx17 = needCxx17 && !existingCxxStandard;

  if (needCxx17 && existingCxxStandard &&
      existingCxxIt < std::find_if(cmArrayBegin(CXX_STANDARDS),
                                   cmArrayEnd(CXX_STANDARDS),
                                   cmStrCmp("17"))) {
    setCxx17 = true;
  } else if (needCxx14 && existingCxxStandard &&
             existingCxxIt < std::find_if(cmArrayBegin(CXX_STANDARDS),
                                          cmArrayEnd(CXX_STANDARDS),
                                          cmStrCmp("14"))) {
    setCxx14 = true;
  } else if (needCxx11 && existingCxxStandard &&
             existingCxxIt < std::find_if(cmArrayBegin(CXX_STANDARDS),
                                          cmArrayEnd(CXX_STANDARDS),
                                          cmStrCmp("11"))) {
    setCxx11 = true;
  } else if (needCxx98 && existingCxxStandard &&
             existingCxxIt < std::find_if(cmArrayBegin(CXX_STANDARDS),
                                          cmArrayEnd(CXX_STANDARDS),
                                          cmStrCmp("98"))) {
    setCxx98 = true;
  }

  if (setCxx17) {
    target->SetProperty("CXX_STANDARD", "17");
    target->SetProperty("CUDA_STANDARD", "17");
  } else if (setCxx14) {
    target->SetProperty("CXX_STANDARD", "14");
    target->SetProperty("CUDA_STANDARD", "14");
  } else if (setCxx11) {
    target->SetProperty("CXX_STANDARD", "11");
    target->SetProperty("CUDA_STANDARD", "11");
  } else if (setCxx98) {
    target->SetProperty("CXX_STANDARD", "98");
    target->SetProperty("CUDA_STANDARD", "98");
  }
  return true;
}